

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.h
# Opt level: O2

void __thiscall cmLinkItemGraphVisitor::cmLinkItemGraphVisitor(cmLinkItemGraphVisitor *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cmLinkItemGraphVisitor = (_func_int **)&PTR__cmLinkItemGraphVisitor_00858fc8;
  p_Var1 = &(this->VisitedItems)._M_t._M_impl.super__Rb_tree_header;
  (this->VisitedItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VisitedItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VisitedItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VisitedItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VisitedItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header;
  (this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->VisitedLinks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

virtual ~cmLinkItemGraphVisitor() = default;